

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  int *piVar1;
  ImGuiDockContext *dc;
  char cVar2;
  ImGuiDockNodeSettings *pIVar3;
  ImGuiDockNode *node;
  ImGuiDockNodeSettings *pIVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ImGuiContext *g;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    iVar9 = (ctx->DockContext).NodesSettings.Capacity;
    if (iVar9 < 0) {
      uVar5 = iVar9 / 2 + iVar9;
      uVar10 = 0;
      if (0 < (int)uVar5) {
        uVar10 = (ulong)uVar5;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar4 = (ImGuiDockNodeSettings *)(*GImAllocatorAllocFunc)(uVar10 * 0x24,GImAllocatorUserData)
      ;
      pIVar3 = (ctx->DockContext).NodesSettings.Data;
      if (pIVar3 != (ImGuiDockNodeSettings *)0x0) {
        memcpy(pIVar4,pIVar3,(long)(ctx->DockContext).NodesSettings.Size * 0x24);
        pIVar3 = (ctx->DockContext).NodesSettings.Data;
        if ((pIVar3 != (ImGuiDockNodeSettings *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (ctx->DockContext).NodesSettings.Data = pIVar4;
      (ctx->DockContext).NodesSettings.Capacity = (int)uVar10;
    }
    dc = &ctx->DockContext;
    (ctx->DockContext).NodesSettings.Size = 0;
    iVar9 = (ctx->DockContext).Nodes.Data.Size;
    if ((ctx->DockContext).NodesSettings.Capacity < iVar9) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar4 = (ImGuiDockNodeSettings *)
               (*GImAllocatorAllocFunc)((long)iVar9 * 0x24,GImAllocatorUserData);
      pIVar3 = (ctx->DockContext).NodesSettings.Data;
      if (pIVar3 != (ImGuiDockNodeSettings *)0x0) {
        memcpy(pIVar4,pIVar3,(long)(ctx->DockContext).NodesSettings.Size * 0x24);
        pIVar3 = (ctx->DockContext).NodesSettings.Data;
        if ((pIVar3 != (ImGuiDockNodeSettings *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (ctx->DockContext).NodesSettings.Data = pIVar4;
      (ctx->DockContext).NodesSettings.Capacity = iVar9;
    }
    if (0 < (dc->Nodes).Data.Size) {
      lVar11 = 8;
      lVar6 = 0;
      do {
        node = *(ImGuiDockNode **)((long)&((ctx->DockContext).Nodes.Data.Data)->key + lVar11);
        if ((node != (ImGuiDockNode *)0x0) && (node->ParentNode == (ImGuiDockNode *)0x0)) {
          DockSettingsHandler_DockNodeToSettings(dc,node,0);
        }
        lVar6 = lVar6 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar6 < (dc->Nodes).Data.Size);
    }
    lVar6 = (long)(ctx->DockContext).NodesSettings.Size;
    if (lVar6 < 1) {
      iVar9 = 0;
    }
    else {
      lVar11 = 0;
      iVar9 = 0;
      do {
        iVar7 = (int)(&((ctx->DockContext).NodesSettings.Data)->Depth)[lVar11];
        if (iVar9 < iVar7) {
          iVar9 = iVar7;
        }
        lVar11 = lVar11 + 0x24;
      } while (lVar6 * 0x24 != lVar11);
    }
    ImGuiTextBuffer::appendf(buf,"[%s][Data]\n",handler->TypeName);
    if (0 < (ctx->DockContext).NodesSettings.Size) {
      lVar11 = 0x22;
      lVar6 = 0;
      do {
        pIVar3 = (ctx->DockContext).NodesSettings.Data;
        iVar7 = (int)*(char *)((long)pIVar3 + lVar11 + -0x11);
        pcVar8 = "DockSpace";
        if ((*(uint *)((long)pIVar3 + lVar11 + -0xe) >> 10 & 1) == 0) {
          pcVar8 = "DockNode ";
        }
        pcVar12 = "";
        ImGuiTextBuffer::appendf
                  (buf,"%*s%s%*s",(ulong)(uint)(iVar7 * 2),"",pcVar8,
                   (ulong)(uint)((iVar9 - iVar7) * 2),"");
        ImGuiTextBuffer::appendf(buf," ID=0x%08X",(ulong)*(uint *)((long)pIVar3 + lVar11 + -0x22));
        uVar5 = *(uint *)((long)pIVar3 + lVar11 + -0x1e);
        if (uVar5 == 0) {
          if (*(int *)((long)pIVar3 + lVar11 + -0x1a) != 0) {
            ImGuiTextBuffer::appendf(buf," Window=0x%08X");
          }
          ImGuiTextBuffer::appendf
                    (buf," Pos=%d,%d Size=%d,%d",
                     (ulong)(uint)(int)*(short *)((long)pIVar3 + lVar11 + -10),
                     (ulong)(uint)(int)*(short *)((long)pIVar3 + lVar11 + -8),
                     (ulong)(uint)(int)*(short *)((long)pIVar3 + lVar11 + -6),
                     (ulong)(uint)(int)*(short *)((long)pIVar3 + lVar11 + -4),pcVar12);
        }
        else {
          ImGuiTextBuffer::appendf
                    (buf," Parent=0x%08X SizeRef=%d,%d",(ulong)uVar5,
                     (ulong)(uint)(int)*(short *)((long)pIVar3 + lVar11 + -2),
                     (ulong)(uint)(int)*(short *)((long)&pIVar3->ID + lVar11));
        }
        cVar2 = *(char *)((long)pIVar3 + lVar11 + -0x12);
        if (cVar2 != -1) {
          ImGuiTextBuffer::appendf(buf," Split=%c",(ulong)(0x59 - (cVar2 == '\0')));
        }
        if ((*(byte *)((long)pIVar3 + lVar11 + -0xe) & 0x20) != 0) {
          ImGuiTextBuffer::appendf(buf," NoResize=1");
        }
        if ((*(byte *)((long)pIVar3 + lVar11 + -0xd) & 8) != 0) {
          ImGuiTextBuffer::appendf(buf," CentralNode=1");
        }
        if ((*(byte *)((long)pIVar3 + lVar11 + -0xd) & 0x10) != 0) {
          ImGuiTextBuffer::appendf(buf," NoTabBar=1");
        }
        if ((*(byte *)((long)pIVar3 + lVar11 + -0xd) & 0x20) != 0) {
          ImGuiTextBuffer::appendf(buf," HiddenTabBar=1");
        }
        if ((*(byte *)((long)pIVar3 + lVar11 + -0xd) & 0x40) != 0) {
          ImGuiTextBuffer::appendf(buf," NoWindowMenuButton=1");
        }
        if ((*(byte *)((long)pIVar3 + lVar11 + -0xd) & 0x80) != 0) {
          ImGuiTextBuffer::appendf(buf," NoCloseButton=1");
        }
        if (*(int *)((long)pIVar3 + lVar11 + -0x16) != 0) {
          ImGuiTextBuffer::appendf(buf," Selected=0x%08X");
        }
        ImGuiTextBuffer::appendf(buf,"\n");
        lVar6 = lVar6 + 1;
        lVar11 = lVar11 + 0x24;
      } while (lVar6 < (ctx->DockContext).NodesSettings.Size);
    }
    ImGuiTextBuffer::appendf(buf,"\n");
    return;
  }
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Gather settings data
    // (unlike our windows settings, because nodes are always built we can do a full rewrite of the SettingsNode buffer)
    dc->NodesSettings.resize(0);
    dc->NodesSettings.reserve(dc->Nodes.Data.Size);
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsRootNode())
                DockSettingsHandler_DockNodeToSettings(dc, node, 0);

    int max_depth = 0;
    for (int node_n = 0; node_n < dc->NodesSettings.Size; node_n++)
        max_depth = ImMax((int)dc->NodesSettings[node_n].Depth, max_depth);

    // Write to text buffer
    buf->appendf("[%s][Data]\n", handler->TypeName);
    for (int node_n = 0; node_n < dc->NodesSettings.Size; node_n++)
    {
        const int line_start_pos = buf->size(); (void)line_start_pos;
        const ImGuiDockNodeSettings* node_settings = &dc->NodesSettings[node_n];
        buf->appendf("%*s%s%*s", node_settings->Depth * 2, "", (node_settings->Flags & ImGuiDockNodeFlags_DockSpace) ? "DockSpace" : "DockNode ", (max_depth - node_settings->Depth) * 2, "");  // Text align nodes to facilitate looking at .ini file
        buf->appendf(" ID=0x%08X", node_settings->ID);
        if (node_settings->ParentNodeId)
        {
            buf->appendf(" Parent=0x%08X SizeRef=%d,%d", node_settings->ParentNodeId, node_settings->SizeRef.x, node_settings->SizeRef.y);
        }
        else
        {
            if (node_settings->ParentWindowId)
                buf->appendf(" Window=0x%08X", node_settings->ParentWindowId);
            buf->appendf(" Pos=%d,%d Size=%d,%d", node_settings->Pos.x, node_settings->Pos.y, node_settings->Size.x, node_settings->Size.y);
        }
        if (node_settings->SplitAxis != ImGuiAxis_None)
            buf->appendf(" Split=%c", (node_settings->SplitAxis == ImGuiAxis_X) ? 'X' : 'Y');
        if (node_settings->Flags & ImGuiDockNodeFlags_NoResize)
            buf->appendf(" NoResize=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_CentralNode)
            buf->appendf(" CentralNode=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_NoTabBar)
            buf->appendf(" NoTabBar=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_HiddenTabBar)
            buf->appendf(" HiddenTabBar=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_NoWindowMenuButton)
            buf->appendf(" NoWindowMenuButton=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_NoCloseButton)
            buf->appendf(" NoCloseButton=1");
        if (node_settings->SelectedWindowId)
            buf->appendf(" Selected=0x%08X", node_settings->SelectedWindowId);

#if IMGUI_DEBUG_INI_SETTINGS
        // [DEBUG] Include comments in the .ini file to ease debugging
        if (ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_settings->ID))
        {
            buf->appendf("%*s", ImMax(2, (line_start_pos + 92) - buf->size()), "");     // Align everything
            if (node->IsDockSpace() && node->HostWindow && node->HostWindow->ParentWindow)
                buf->appendf(" ; in '%s'", node->HostWindow->ParentWindow->Name);
            // Iterate settings so we can give info about windows that didn't exist during the session.
            int contains_window = 0;
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                if (settings->DockId == node_settings->ID)
                {
                    if (contains_window++ == 0)
                        buf->appendf(" ; contains ");
                    buf->appendf("'%s' ", settings->GetName());
                }
        }
#endif
        buf->appendf("\n");
    }
    buf->appendf("\n");
}